

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_addx_mm_32(m68k_info *info)

{
  uint uVar1;
  
  MCInst_setOpcode(info->inst,6);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
  (info->extension).operands[0].address_mode = M68K_AM_REGI_ADDR_PRE_DEC;
  uVar1 = info->ir;
  (info->extension).operands[0].field_0.reg = (uVar1 & 7) + M68K_REG_A0;
  (info->extension).operands[1].address_mode = M68K_AM_REGI_ADDR_PRE_DEC;
  (info->extension).operands[1].field_0.reg = (uVar1 >> 9 & 7) + M68K_REG_A0;
  return;
}

Assistant:

static void d68000_addx_mm_32(m68k_info *info)
{
	build_mm(info, M68K_INS_ADDX, 4, 0);
}